

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest_tests.cpp
# Opt level: O3

void __thiscall rest_tests::test_query_string::test_method(test_query_string *this)

{
  int iVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char local_13c [4];
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  lazy_ostream local_118;
  undefined1 *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  RESTResponseFormat rf;
  char *local_d0;
  undefined **local_c8 [2];
  undefined1 *local_b8;
  char **local_b0;
  string *local_a8;
  char *local_a0;
  char *local_98;
  assertion_result local_90;
  string param;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  param._M_dataplus._M_p = (pointer)&param.field_2;
  param._M_string_length = 0;
  param.field_2._M_local_buf[0] = '\0';
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"/rest/endpoint/someresource.json","");
  rf = ParseDataFormat(&param,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x14;
  file.m_begin = (iterator)&local_e8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&param,"/rest/endpoint/someresource");
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_98 = "";
  local_48._8_8_ = &local_a8;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  local_d0 = "/rest/endpoint/someresource";
  local_c8[1]._0_1_ = '\0';
  local_c8[0] = &PTR__lazy_ostream_013b0e98;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a8 = &param;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xec505e,(size_t)&local_a0,0x14,local_58,
             "\"/rest/endpoint/someresource\"",local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x15;
  file_00.m_begin = (iterator)&local_128;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_138,
             msg_00);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_d0 = local_13c;
  local_13c[0] = '\x03';
  local_13c[1] = '\0';
  local_13c[2] = '\0';
  local_13c[3] = '\0';
  local_a8 = (string *)&rf;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(rf == JSON);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_98 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013b0ed8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_a8;
  local_c8[1]._0_1_ = '\0';
  local_c8[0] = &PTR__lazy_ostream_013b0ed8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xec509e,(size_t)&local_a0,0x15,local_58,
             "RESTResponseFormat::JSON",local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"/rest/endpoint/someresource.bin?p1=v1","");
  rf = ParseDataFormat(&param,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x19;
  file_01.m_begin = (iterator)&local_150;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_160,
             msg_01);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&param,"/rest/endpoint/someresource");
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_98 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_a8;
  local_d0 = "/rest/endpoint/someresource";
  local_c8[1]._0_1_ = '\0';
  local_c8[0] = &PTR__lazy_ostream_013b0e98;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a8 = &param;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xec505e,(size_t)&local_a0,0x19,local_58,
             "\"/rest/endpoint/someresource\"",local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1a;
  file_02.m_begin = (iterator)&local_170;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_180,
             msg_02);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(rf == BINARY);
  local_13c[0] = '\x01';
  local_13c[1] = '\0';
  local_13c[2] = '\0';
  local_13c[3] = '\0';
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_98 = "";
  local_a8 = (string *)&rf;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013b0ed8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_a8;
  local_d0 = local_13c;
  local_c8[1]._0_1_ = '\0';
  local_c8[0] = &PTR__lazy_ostream_013b0ed8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xec509e,(size_t)&local_a0,0x1a,local_58,
             "RESTResponseFormat::BINARY",local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"/rest/endpoint/someresource.hex?p1=v1&p2=v2","");
  rf = ParseDataFormat(&param,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1e;
  file_03.m_begin = (iterator)&local_190;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1a0,
             msg_03);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&param,"/rest/endpoint/someresource");
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_98 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_a8;
  local_d0 = "/rest/endpoint/someresource";
  local_c8[1]._0_1_ = '\0';
  local_c8[0] = &PTR__lazy_ostream_013b0e98;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a8 = &param;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xec505e,(size_t)&local_a0,0x1e,local_58,
             "\"/rest/endpoint/someresource\"",local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1f;
  file_04.m_begin = (iterator)&local_1b0;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1c0,
             msg_04);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(rf == HEX);
  local_13c[0] = '\x02';
  local_13c[1] = '\0';
  local_13c[2] = '\0';
  local_13c[3] = '\0';
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_98 = "";
  local_a8 = (string *)&rf;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013b0ed8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_a8;
  local_d0 = local_13c;
  local_c8[1]._0_1_ = '\0';
  local_c8[0] = &PTR__lazy_ostream_013b0ed8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xec509e,(size_t)&local_a0,0x1f,local_58,
             "RESTResponseFormat::HEX",local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"/rest/endpoint/someresource.json&p1=v1","");
  rf = ParseDataFormat(&param,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x23;
  file_05.m_begin = (iterator)&local_1d0;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1e0,
             msg_05);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&param,"/rest/endpoint/someresource.json&p1=v1");
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_98 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_a8;
  local_d0 = "/rest/endpoint/someresource.json&p1=v1";
  local_c8[1]._0_1_ = '\0';
  local_c8[0] = &PTR__lazy_ostream_013b0f18;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a8 = &param;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xec505e,(size_t)&local_a0,0x23,local_58,
             "\"/rest/endpoint/someresource.json&p1=v1\"",local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x24;
  file_06.m_begin = (iterator)&local_1f0;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_200,
             msg_06);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(rf == UNDEF);
  local_13c[0] = '\0';
  local_13c[1] = '\0';
  local_13c[2] = '\0';
  local_13c[3] = '\0';
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_98 = "";
  local_a8 = (string *)&rf;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013b0ed8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_a8;
  local_d0 = local_13c;
  local_c8[1]._0_1_ = '\0';
  local_c8[0] = &PTR__lazy_ostream_013b0ed8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xec509e,(size_t)&local_a0,0x24,local_58,
             "RESTResponseFormat::UNDEF",local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"/rest/endpoint/someresource?p1=v1","");
  rf = ParseDataFormat(&param,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = &DAT_00000028;
  file_07.m_begin = (iterator)&local_210;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_220,
             msg_07);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&param,"/rest/endpoint/someresource");
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_98 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_a8;
  local_d0 = "/rest/endpoint/someresource";
  local_c8[1]._0_1_ = '\0';
  local_c8[0] = &PTR__lazy_ostream_013b0e98;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a8 = &param;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xec505e,(size_t)&local_a0,0x28,local_58,
             "\"/rest/endpoint/someresource\"",local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x29;
  file_08.m_begin = (iterator)&local_230;
  msg_08.m_end = pvVar3;
  msg_08.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_240,
             msg_08);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(rf == UNDEF);
  local_13c[0] = '\0';
  local_13c[1] = '\0';
  local_13c[2] = '\0';
  local_13c[3] = '\0';
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_98 = "";
  local_a8 = (string *)&rf;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013b0ed8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_a8;
  local_d0 = local_13c;
  local_c8[1]._0_1_ = '\0';
  local_c8[0] = &PTR__lazy_ostream_013b0ed8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xec509e,(size_t)&local_a0,0x29,local_58,
             "RESTResponseFormat::UNDEF",local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"/rest/endpoint/someresource?p1=v1.json","");
  rf = ParseDataFormat(&param,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x2d;
  file_09.m_begin = (iterator)&local_250;
  msg_09.m_end = pvVar3;
  msg_09.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_260,
             msg_09);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&param,"/rest/endpoint/someresource");
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_98 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_a8;
  local_d0 = "/rest/endpoint/someresource";
  local_c8[1]._0_1_ = '\0';
  local_c8[0] = &PTR__lazy_ostream_013b0e98;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a8 = &param;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xec505e,(size_t)&local_a0,0x2d,local_58,
             "\"/rest/endpoint/someresource\"",local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x2e;
  file_10.m_begin = (iterator)&local_270;
  msg_10.m_end = pvVar3;
  msg_10.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_280,
             msg_10);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(rf == UNDEF);
  local_13c[0] = '\0';
  local_13c[1] = '\0';
  local_13c[2] = '\0';
  local_13c[3] = '\0';
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rest_tests.cpp";
  local_98 = "";
  local_a8 = (string *)&rf;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013b0ed8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_a8;
  local_d0 = local_13c;
  local_c8[1]._0_1_ = '\0';
  local_c8[0] = &PTR__lazy_ostream_013b0ed8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xec509e,(size_t)&local_a0,0x2e,local_58,
             "RESTResponseFormat::UNDEF",local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)param._M_dataplus._M_p != &param.field_2) {
    operator_delete(param._M_dataplus._M_p,
                    CONCAT71(param.field_2._M_allocated_capacity._1_7_,param.field_2._M_local_buf[0]
                            ) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_query_string)
{
    std::string param;
    RESTResponseFormat rf;
    // No query string
    rf = ParseDataFormat(param, "/rest/endpoint/someresource.json");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::JSON);

    // Query string with single parameter
    rf = ParseDataFormat(param, "/rest/endpoint/someresource.bin?p1=v1");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::BINARY);

    // Query string with multiple parameters
    rf = ParseDataFormat(param, "/rest/endpoint/someresource.hex?p1=v1&p2=v2");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::HEX);

    // Incorrectly formed query string will not be handled
    rf = ParseDataFormat(param, "/rest/endpoint/someresource.json&p1=v1");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource.json&p1=v1");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::UNDEF);

    // Omitted data format with query string should return UNDEF and hide query string
    rf = ParseDataFormat(param, "/rest/endpoint/someresource?p1=v1");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::UNDEF);

    // Data format specified after query string
    rf = ParseDataFormat(param, "/rest/endpoint/someresource?p1=v1.json");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::UNDEF);
}